

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O3

void __thiscall
testing::StrictMock<solitaire::archivers::HistoryTrackerMock>::StrictMock
          (StrictMock<solitaire::archivers::HistoryTrackerMock> *this)

{
  FunctionMocker<void_()> *this_00;
  
  Mock::FailUninterestingCalls(this);
  this_00 = &(this->super_HistoryTrackerMock).gmock00_reset_10;
  memset(this_00,0,0x120);
  (this->super_HistoryTrackerMock).super_HistoryTracker._vptr_HistoryTracker =
       (_func_int **)&PTR__HistoryTrackerMock_0031c268;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&this_00->super_UntypedFunctionMockerBase);
  (this->super_HistoryTrackerMock).gmock00_reset_10.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00318328;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_HistoryTrackerMock).gmock01_save_11.super_UntypedFunctionMockerBase);
  (this->super_HistoryTrackerMock).gmock01_save_11.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_0031c2a8;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_HistoryTrackerMock).gmock00_undo_12.super_UntypedFunctionMockerBase);
  (this->super_HistoryTrackerMock).gmock00_undo_12.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00318328;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_HistoryTrackerMock).gmock10_getHistorySize_13.
              super_UntypedFunctionMockerBase);
  (this->super_HistoryTrackerMock).gmock10_getHistorySize_13.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_0031c110;
  (this->super_HistoryTrackerMock).super_HistoryTracker._vptr_HistoryTracker =
       (_func_int **)&PTR__StrictMock_0031c1b8;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }